

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.hpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::DOMDocumentImpl::getPooledNString(DOMDocumentImpl *this,XMLCh *in,XMLSize_t n)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  XMLSize_t sizeToAllocate;
  XMLSize_t inHash;
  DOMStringPoolEntry *spe;
  DOMStringPoolEntry **pspe;
  XMLSize_t n_local;
  XMLCh *in_local;
  DOMDocumentImpl *this_local;
  DOMStringPoolEntry *pDVar4;
  
  if (in == (XMLCh *)0x0) {
    this_local = (DOMDocumentImpl *)0x0;
  }
  else {
    XVar3 = XMLString::hashN(in,n,this->fNameTableSize);
    for (spe = (DOMStringPoolEntry *)(this->fNameTable + XVar3);
        spe->fNext != (DOMStringPoolEntry *)0x0; spe = spe->fNext) {
      if ((spe->fNext->fLength == n) &&
         (bVar1 = XMLString::equalsN(spe->fNext->fString,in,n), bVar1)) {
        return spe->fNext->fString;
      }
    }
    iVar2 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,n * 2 + 0x18);
    pDVar4 = (DOMStringPoolEntry *)CONCAT44(extraout_var,iVar2);
    spe->fNext = pDVar4;
    pDVar4->fLength = n;
    pDVar4->fNext = (DOMStringPoolEntry *)0x0;
    XMLString::copyNString(pDVar4->fString,in,n);
    this_local = (DOMDocumentImpl *)pDVar4->fString;
  }
  return (XMLCh *)this_local;
}

Assistant:

inline const XMLCh* DOMDocumentImpl::getPooledNString(const XMLCh *in, XMLSize_t n)
{
  if (in == 0)
    return 0;

  DOMStringPoolEntry    **pspe;
  DOMStringPoolEntry    *spe;

  XMLSize_t inHash = XMLString::hashN(in, n, fNameTableSize);
  pspe = &fNameTable[inHash];
  while (*pspe != 0)
  {
    if ((*pspe)->fLength == n && XMLString::equalsN((*pspe)->fString, in, n))
      return (*pspe)->fString;
    pspe = &((*pspe)->fNext);
  }

  // This string hasn't been seen before.  Add it to the pool.
  //

  // Compute size to allocate.  Note that there's 1 char of string
  // declared in the struct, so we don't need to add one again to
  // account for the trailing null.
  //
  XMLSize_t sizeToAllocate = sizeof(DOMStringPoolEntry) + n*sizeof(XMLCh);
  *pspe = spe = (DOMStringPoolEntry *)allocate(sizeToAllocate);
  spe->fLength = n;
  spe->fNext = 0;
  XMLString::copyNString((XMLCh*)spe->fString, in, n);

  return spe->fString;
}